

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::flags_internal::Unparse_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,short v)

{
  undefined2 extraout_DX;
  undefined6 extraout_var;
  AlphaNum local_40;
  
  AlphaNum::AlphaNum(&local_40,(int)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_40,
                    (AlphaNum *)CONCAT62(extraout_var,extraout_DX));
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(short v) { return absl::StrCat(v); }